

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

void __thiscall
optimization::common_expr_del::BlockNodes::export_insts(BlockNodes *this,BasicBlk *block)

{
  __index_type _Var1;
  bool bVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  pointer puVar5;
  Inst *pIVar6;
  element_type *peVar7;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  pointer pcVar8;
  pointer pvVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var10;
  long lVar11;
  _List_node_base **pp_Var12;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *this_01;
  BasicBlk *pBVar13;
  int iVar14;
  _List_node_base *p_Var15;
  variant_alternative_t<0UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar16;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar17;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar18;
  variant_alternative_t<2UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  variant_alternative_t<1UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar21;
  variant_alternative_t<0UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar22;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var23;
  Displayable DVar24;
  mapped_type *pmVar25;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar26;
  mapped_type *pmVar27;
  _List_node_base *p_Var28;
  _List_node_base *p_Var29;
  byte bVar30;
  pointer psVar31;
  pointer *__ptr_1;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var32;
  pointer pvVar33;
  undefined8 *puVar34;
  uint idx;
  ulong uVar35;
  pointer puVar36;
  pointer *__ptr;
  pointer puVar37;
  BlockNodes *this_02;
  long lVar38;
  Value lhs;
  VarId varId;
  Value rhs;
  Var_Replace vp;
  iterator __end2;
  Value offset_1;
  undefined1 local_358 [8];
  variant<int,_mir::inst::VarId> vStack_350;
  undefined1 local_338 [8];
  variant<int,_mir::inst::VarId> local_330;
  __index_type local_318;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_310;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_308;
  _List_node_base *local_300;
  undefined1 local_2f8 [8];
  variant<int,_mir::inst::VarId> vStack_2f0;
  undefined1 local_2d8 [8];
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_2d0;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_2a0;
  _List_node_base *local_270;
  pointer local_268;
  BlockNodes *local_260;
  _List_node_base *local_258;
  VarId local_250;
  _List_node_base *local_240;
  undefined1 local_238 [8];
  variant<int,_mir::inst::VarId> local_230;
  BasicBlk *local_218;
  undefined **local_210;
  undefined **local_208;
  undefined **local_200;
  undefined **local_1f8;
  undefined **local_1f0;
  anon_class_8_1_a78179b7_conflict local_1e8;
  VarId local_1e0;
  VarId local_1d0;
  Operand local_1c0;
  Operand local_198;
  Operand local_170;
  Operand local_148;
  Operand local_120;
  Operand local_f8;
  Operand local_d0;
  Operand local_a8;
  Operand local_80;
  Operand local_58;
  
  psVar31 = (this->nodes).
            super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar31 !=
      (this->nodes).
      super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      Node::init_main_var((psVar31->
                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr);
      psVar31 = psVar31 + 1;
    } while (psVar31 !=
             (this->nodes).
             super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  while (uVar35 = (long)(this->nodes).
                        super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4,
        (this->added)._M_t._M_impl.super__Rb_tree_header._M_node_count < uVar35) {
    if (-1 < (int)uVar35 + -1) {
      do {
        idx = (int)uVar35 - 1;
        uVar35 = (ulong)idx;
        exportNode(this,idx);
      } while (0 < (int)idx);
    }
  }
  puVar36 = (block->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (block->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar37 = puVar36;
  local_260 = this;
  if (puVar5 != puVar36) {
    do {
      pIVar6 = (puVar37->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if (pIVar6 != (Inst *)0x0) {
        (*(pIVar6->super_Displayable)._vptr_Displayable[5])();
      }
      (puVar37->_M_t).super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
      _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
      super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar37 = puVar37 + 1;
    } while (puVar37 != puVar5);
    (block->inst).
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar36;
  }
  local_308 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
               *)&block->inst;
  local_270 = (_List_node_base *)&local_260->exportQueue;
  p_Var29 = (local_260->exportQueue).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  p_Var15 = local_270;
  p_Var28 = p_Var29;
  this_02 = local_260;
  local_218 = block;
  if (p_Var29 != local_270) {
    do {
      p_Var15 = p_Var15->_M_prev;
      if (p_Var28 == p_Var15) break;
      uVar3 = *(undefined4 *)&p_Var28[1]._M_next;
      *(undefined4 *)&p_Var28[1]._M_next = *(undefined4 *)&p_Var15[1]._M_next;
      *(undefined4 *)&p_Var15[1]._M_next = uVar3;
      pp_Var12 = &p_Var28->_M_next;
      p_Var28 = *pp_Var12;
    } while (*pp_Var12 != p_Var15);
    if (p_Var29 != local_270) {
      local_1f0 = &PTR_display_001f03d8;
      local_310._M_head_impl = (Inst *)&PTR_display_001effc8;
      local_240 = (_List_node_base *)&PTR_display_001f0018;
      local_208 = &PTR_display_001f01f8;
      local_210 = &PTR_display_001f02b8;
      local_1f8 = &PTR_display_001f0198;
      local_200 = &PTR_display_001f0378;
      do {
        psVar31 = (this_02->nodes).
                  super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar7 = psVar31[*(uint *)&p_Var29[1]._M_next].
                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar7->is_leaf == false) {
          psVar31 = psVar31 + *(uint *)&p_Var29[1]._M_next;
          _Var1 = (peVar7->op).
                  super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                  .
                  super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                  .
                  super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                  .
                  super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                  .
                  super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                  .
                  super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                  ._M_index;
          if (_Var1 == '\x02') {
            pvVar18 = std::
                      get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&peVar7->op);
            local_300 = p_Var29;
            local_268 = psVar31;
            if (*pvVar18 == Call) {
              pvVar19 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  ((((psVar31->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->operands).
                                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0xffffffffffffffff);
              local_338 = (undefined1  [8])
                          ((long)&local_330.super__Variant_base<int,_mir::inst::VarId>.
                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
              pcVar8 = (pvVar19->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_338,pcVar8,pcVar8 + pvVar19->_M_string_length);
              std::
              vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::pop_back(&((psVar31->
                           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->operands);
              local_2f8 = (undefined1  [8])0x0;
              vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
              vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
              peVar7 = (psVar31->
                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              pvVar9 = (peVar7->operands).
                       super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pvVar33 = *(pointer *)&peVar7->operands; psVar31 = local_268, pvVar33 != pvVar9;
                  pvVar33 = pvVar33 + 1) {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2d8,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)pvVar33);
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_1c0,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2d8);
                convert_operand_to_value((Value *)local_358,this_02,&local_1c0);
                std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
                emplace_back<mir::inst::Value>
                          ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2f8,
                           (Value *)local_358);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_1c0.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_238,&local_1c0);
                local_1c0.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [(byte)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left]._M_data)
                          ((anon_class_1_0_00000001 *)local_358,
                           (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2d8);
              }
              pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((local_268->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              std::
              make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                        ((VarId *)local_2d8,pbVar20,
                         (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_338);
              local_358 = local_2d8;
              local_2d8 = (undefined1  [8])0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_308,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_358);
              p_Var29 = local_300;
              if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                  != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
                (**(code **)(*(long *)local_358 + 0x28))();
              }
              std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>
                           *)local_2d8);
              if ((__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)
                  local_2f8 !=
                  (__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)0x0
                 ) {
                operator_delete((void *)local_2f8,
                                vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ -
                                (long)local_2f8);
              }
              if (local_338 !=
                  (undefined1  [8])
                  ((long)&local_330.super__Variant_base<int,_mir::inst::VarId>.
                          super__Move_assign_alias<int,_mir::inst::VarId>.
                          super__Copy_assign_alias<int,_mir::inst::VarId>.
                          super__Move_ctor_alias<int,_mir::inst::VarId>.
                          super__Copy_ctor_alias<int,_mir::inst::VarId>.
                          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8)) {
                operator_delete((void *)local_338,
                                local_330.super__Variant_base<int,_mir::inst::VarId>.
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ + 1);
              }
            }
            pvVar18 = std::
                      get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&((psVar31->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->op);
            if (*pvVar18 == Phi) {
              local_358 = (undefined1  [8])0x0;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = (VarId *)0x0;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = (VarId *)0x0;
              peVar7 = (psVar31->
                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              p_Var15 = *(_List_node_base **)&peVar7->operands;
              local_258 = (_List_node_base *)
                          (peVar7->operands).
                          super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              if (p_Var15 != local_258) {
                do {
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_2d8,
                                    (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)p_Var15);
                  pvVar21 = std::
                            get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                      ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_2d8);
                  psVar31 = (this_02->nodes).
                            super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  peVar7 = psVar31[pvVar21->id].
                           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  this_00 = psVar31[pvVar21->id].
                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      this_00->_M_use_count = this_00->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      this_00->_M_use_count = this_00->_M_use_count + 1;
                    }
                  }
                  local_2f8 = (undefined1  [8])&PTR_display_001ee058;
                  vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                       (_Uninitialized<int,_true>)-1;
                  if ((peVar7->mainVar).field_0x18 == '\0') {
                    if ((peVar7->live_vars).
                        super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                        _M_impl._M_node._M_size != 0) {
                      vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                           (_Uninitialized<int,_true>)
                           *(uint32_t *)
                            (*(long *)&(peVar7->live_vars).
                                       super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                            + 0x18);
                      goto LAB_0012b32f;
                    }
                    uVar4 = *(uint32_t *)
                             (*(long *)&(peVar7->local_vars).
                                        super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             + 0x18);
                    vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                         (_Uninitialized<int,_true>)uVar4;
                    peVar7 = (local_268->
                             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr;
                    DVar24._vptr_Displayable = (_func_int **)operator_new(0x38);
                    local_330.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                         (peVar7->mainVar).field_0x18;
                    local_238 = (undefined1  [8])&local_330;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr
                      [(long)(char)local_330.super__Variant_base<int,_mir::inst::VarId>.
                                   super__Move_assign_alias<int,_mir::inst::VarId>.
                                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]
                      ._M_data)((anon_class_8_1_a78179b7_conflict *)local_238,
                                (variant<int,_mir::inst::VarId> *)&(peVar7->mainVar).field_0x8);
                    _Var32._M_head_impl = local_310._M_head_impl;
                    local_338 = (undefined1  [8])local_310._M_head_impl;
                    local_330.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ =
                         (peVar7->mainVar).shift;
                    local_330.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ =
                         (peVar7->mainVar).shift_amount;
                    (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable
                         = (_func_int **)&PTR_display_001ee058;
                    *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
                    *DVar24._vptr_Displayable = (_func_int *)local_240;
                    local_238 = (undefined1  [8])(DVar24._vptr_Displayable + 4);
                    *(undefined1 *)(DVar24._vptr_Displayable + 6) = 0xff;
                    *(__index_type *)(DVar24._vptr_Displayable + 6) =
                         local_330.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr
                      [(long)(char)local_330.super__Variant_base<int,_mir::inst::VarId>.
                                   super__Move_assign_alias<int,_mir::inst::VarId>.
                                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]
                      ._M_data)((anon_class_8_1_a78179b7_conflict *)local_238,&local_330);
                    (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable
                         = (_func_int **)_Var32._M_head_impl;
                    *(undefined2 *)((long)DVar24._vptr_Displayable + 0x31) =
                         local_330.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                    local_338 = (undefined1  [8])DVar24._vptr_Displayable;
                    std::
                    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    ::
                    emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                              (local_308,
                               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )local_338);
                    this_02 = local_260;
                    p_Var29 = local_300;
                    if (local_338 != (undefined1  [8])0x0) {
                      (**(code **)(*(_func_int **)local_338 + 0x28))();
                    }
                  }
                  else {
                    pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)
                                         &(peVar7->mainVar).field_0x8);
                    vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                         (_Uninitialized<int,_true>)pvVar26->id;
LAB_0012b32f:
                  }
                  if (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ ==
                      vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_) {
                    std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                    _M_realloc_insert<mir::inst::VarId_const&>
                              ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
                               local_358,
                               (iterator)
                               vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_,
                               (VarId *)local_2f8);
                  }
                  else {
                    *(undefined ***)
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                         &PTR_display_001ee058;
                    *(_Uninitialized<int,_true> *)
                     (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                      super__Move_assign_alias<int,_mir::inst::VarId>.
                      super__Copy_assign_alias<int,_mir::inst::VarId>.
                      super__Move_ctor_alias<int,_mir::inst::VarId>.
                      super__Copy_ctor_alias<int,_mir::inst::VarId>.
                      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ + 8) =
                         vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first.
                         _M_storage;
                    vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                         vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ + 0x10;
                  }
                  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                  }
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                    ::_S_vtable._M_arr
                    [(byte)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left]._M_data)
                            ((anon_class_1_0_00000001 *)local_338,
                             (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_2d8);
                  p_Var15 = (_List_node_base *)&p_Var15[2]._M_prev;
                } while (p_Var15 != local_258);
              }
              pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((local_268->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              DVar24._vptr_Displayable = (_func_int **)operator_new(0x40);
              uVar4 = pvVar26->id;
              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                        ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2d8,
                         (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_358);
              (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
              *DVar24._vptr_Displayable = (_func_int *)local_1f0;
              (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              *(uint32_t *)(DVar24._vptr_Displayable + 4) = uVar4;
              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                        ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                         (DVar24._vptr_Displayable + 5),
                         (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2d8);
              local_338 = (undefined1  [8])DVar24._vptr_Displayable;
              if (local_2d8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_2d8,
                                local_2d0._M_impl.super__Rb_tree_header._M_header._0_8_ -
                                (long)local_2d8);
              }
              local_2d8 = local_338;
              local_338 = (undefined1  [8])0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_308,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_2d8);
              if (local_2d8 != (undefined1  [8])0x0) {
                (**(code **)(*(_func_int **)local_2d8 + 0x28))();
              }
              if (local_338 != (undefined1  [8])0x0) {
                std::default_delete<mir::inst::PhiInst>::operator()
                          ((default_delete<mir::inst::PhiInst> *)local_338,(PhiInst *)local_338);
              }
              if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                  != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
                uVar35 = vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ -
                         (long)local_358;
                _Var32._M_head_impl = (Inst *)local_358;
LAB_0012bbcf:
                operator_delete(_Var32._M_head_impl,uVar35);
              }
            }
            else {
              pvVar18 = std::
                        get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                  (&((psVar31->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->op);
              if (*pvVar18 == Load) {
                pvVar21 = std::
                          get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                    (*(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       **)&((psVar31->
                                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr)->operands);
                peVar7 = (this_02->nodes).
                         super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pvVar21->id].
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                     (peVar7->mainVar).field_0x18;
                local_2d8 = (undefined1  [8])&vStack_350;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                  _M_data)((anon_class_8_1_a78179b7_conflict *)local_2d8,
                           (variant<int,_mir::inst::VarId> *)&(peVar7->mainVar).field_0x8);
                local_358 = (undefined1  [8])local_310._M_head_impl;
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ = (peVar7->mainVar).shift
                ;
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ =
                     (peVar7->mainVar).shift_amount;
                if (this_02->offset_inst == true) {
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_f8,
                                    (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)(*(long *)&((psVar31->
                                                                                                      
                                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->operands + 0x28));
                  convert_operand_to_value((Value *)local_2f8,this_02,&local_f8);
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                    ::_S_vtable._M_arr
                    [local_f8.
                     super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_f8);
                  p_Var29 = local_300;
                  local_f8.
                  super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  ._M_index = 0xff;
                  pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &(((psVar31->
                                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->mainVar).field_0x8);
                  DVar24._vptr_Displayable = (_func_int **)operator_new(0x58);
                  local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                       vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                  local_238 = (undefined1  [8])(local_2d8 + 8);
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                    _M_data)((anon_class_8_1_a78179b7_conflict *)local_238,&vStack_350);
                  local_2d8 = (undefined1  [8])local_310._M_head_impl;
                  local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                       vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                  local_238 = (undefined1  [8])&PTR_display_001ee058;
                  local_230.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                       (_Uninitialized<int,_true>)pvVar26->id;
                  local_330.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                       vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                  local_250.super_Displayable._vptr_Displayable = (_func_int **)&local_330;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                    _M_data)((anon_class_8_1_a78179b7_conflict *)&local_250,&vStack_2f0);
                  local_338 = (undefined1  [8])local_310._M_head_impl;
                  local_330.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                       vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                  mir::inst::LoadOffsetInst::LoadOffsetInst
                            ((LoadOffsetInst *)DVar24._vptr_Displayable,(Value *)local_2d8,
                             (VarId *)local_238,(Value *)local_338);
                  local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  ::
                  emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                            (local_308,
                             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             local_2d8);
                  goto LAB_0012b026;
                }
                pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &(((psVar31->
                                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->mainVar).field_0x8);
                DVar24._vptr_Displayable = (_func_int **)operator_new(0x38);
                local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                local_338 = (undefined1  [8])(local_2d8 + 8);
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                  _M_data)((anon_class_8_1_a78179b7_conflict *)local_338,&vStack_350);
                _Var32._M_head_impl = local_310._M_head_impl;
                local_2d8 = (undefined1  [8])local_310._M_head_impl;
                local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                uVar4 = pvVar26->id;
                (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                     (_func_int **)&PTR_display_001ee058;
                *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
                *DVar24._vptr_Displayable = (_func_int *)local_208;
                local_338 = (undefined1  [8])(DVar24._vptr_Displayable + 4);
                *(undefined1 *)(DVar24._vptr_Displayable + 6) = 0xff;
                *(undefined1 *)(DVar24._vptr_Displayable + 6) =
                     local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1
                  ]._M_data)((anon_class_8_1_a78179b7_conflict *)local_338,
                             (variant<int,_mir::inst::VarId> *)(local_2d8 + 8));
                (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                     (_func_int **)_Var32._M_head_impl;
                *(undefined2 *)((long)DVar24._vptr_Displayable + 0x31) =
                     local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
                local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          (local_308,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           local_2d8);
                p_Var29 = local_300;
                if (local_2d8 == (undefined1  [8])0x0) goto switchD_0012b061_default;
LAB_0012b037:
                (**(code **)(*(_func_int **)local_2d8 + 0x28))();
              }
              else {
                pvVar18 = std::
                          get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                    (&((psVar31->
                                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->op);
                if (*pvVar18 == Store) {
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_120,
                                    *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      **)&((psVar31->
                                           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->operands);
                  convert_operand_to_value((Value *)local_358,this_02,&local_120);
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                    ::_S_vtable._M_arr
                    [local_120.
                     super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_120);
                  local_120.
                  super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  ._M_index = 0xff;
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_148,
                                    (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)(*(long *)&((psVar31->
                                                                                                      
                                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->operands + 0x28));
                  convert_operand_to_value((Value *)local_2f8,this_02,&local_148);
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                    ::_S_vtable._M_arr
                    [local_148.
                     super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     .
                     super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                     ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_148);
                  local_148.
                  super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  ._M_index = 0xff;
                  if (this_02->offset_inst == true) {
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&local_170,
                                      (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)(*(long *)&((psVar31->
                                                                                                          
                                                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->operands + 0x50));
                    convert_operand_to_value((Value *)local_238,this_02,&local_170);
                    (*std::__detail::__variant::
                      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                      ::_S_vtable._M_arr
                      [local_170.
                       super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                       .
                       super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                       .
                       super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                       .
                       super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                       .
                       super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                       ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_170);
                    local_170.
                    super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                    .
                    super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                    .
                    super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                    ._M_index = 0xff;
                    pvVar26 = std::get<1ul,int,mir::inst::VarId>(&vStack_2f0);
                    DVar24._vptr_Displayable = (_func_int **)operator_new(0x58);
                    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                         vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                    local_250.super_Displayable._vptr_Displayable = (_func_int **)(local_2d8 + 8);
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr
                      [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                   super__Move_assign_alias<int,_mir::inst::VarId>.
                                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]
                      ._M_data)((anon_class_8_1_a78179b7_conflict *)&local_250,&vStack_350);
                    local_2d8 = (undefined1  [8])local_310._M_head_impl;
                    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                         vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                    local_250.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001ee058;
                    local_250.id = pvVar26->id;
                    local_330.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                         local_230.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                    local_1e8.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_330;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr
                      [(long)(char)local_230.super__Variant_base<int,_mir::inst::VarId>.
                                   super__Move_assign_alias<int,_mir::inst::VarId>.
                                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]
                      ._M_data)(&local_1e8,&local_230);
                    local_338 = (undefined1  [8])local_310._M_head_impl;
                    local_330.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                         local_230.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                    mir::inst::StoreOffsetInst::StoreOffsetInst
                              ((StoreOffsetInst *)DVar24._vptr_Displayable,(Value *)local_2d8,
                               &local_250,(Value *)local_338);
                    local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
                    std::
                    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    ::
                    emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                              (local_308,
                               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )local_2d8);
                  }
                  else {
                    pvVar26 = std::get<1ul,int,mir::inst::VarId>(&vStack_2f0);
                    DVar24._vptr_Displayable = (_func_int **)operator_new(0x38);
                    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                         vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                    local_338 = (undefined1  [8])(local_2d8 + 8);
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr
                      [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                   super__Move_assign_alias<int,_mir::inst::VarId>.
                                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]
                      ._M_data)((anon_class_8_1_a78179b7_conflict *)local_338,&vStack_350);
                    _Var32._M_head_impl = local_310._M_head_impl;
                    local_2d8 = (undefined1  [8])local_310._M_head_impl;
                    local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                         vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                    uVar4 = pvVar26->id;
                    (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable
                         = (_func_int **)&PTR_display_001ee058;
                    *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
                    *DVar24._vptr_Displayable = (_func_int *)local_210;
                    local_338 = (undefined1  [8])(DVar24._vptr_Displayable + 4);
                    *(undefined1 *)(DVar24._vptr_Displayable + 6) = 0xff;
                    *(undefined1 *)(DVar24._vptr_Displayable + 6) =
                         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr
                      [(long)(char)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_
                       + 1]._M_data)((anon_class_8_1_a78179b7_conflict *)local_338,
                                     (variant<int,_mir::inst::VarId> *)(local_2d8 + 8));
                    (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable
                         = (_func_int **)_Var32._M_head_impl;
                    *(undefined2 *)((long)DVar24._vptr_Displayable + 0x31) =
                         local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
                    local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
                    std::
                    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    ::
                    emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                              (local_308,
                               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *
                               )local_2d8);
                  }
LAB_0012b026:
                  if (local_2d8 != (undefined1  [8])0x0) goto LAB_0012b037;
                }
              }
            }
          }
          else if (_Var1 == '\x01') {
            pvVar17 = std::
                      get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&peVar7->op);
            switch(*pvVar17) {
            case Ref:
              local_338 = (undefined1  [8])&PTR_display_001ee058;
              local_330.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                   (_Uninitialized<int,_true>)-1;
              local_318 = '\0';
              __v = *(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)&((psVar31->
                           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->operands;
              if ((__v->
                  super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).
                  super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  .
                  super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                  ._M_index == '\x01') {
                pvVar21 = std::
                          get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                    (__v);
                pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &(((this_02->nodes).
                                        super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[pvVar21->id].
                                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->mainVar).field_0x8);
                std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                          ((variant<mir::inst::VarId,std::__cxx11::string> *)local_338,pvVar26);
              }
              else {
                pvVar19 = std::
                          get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                    (__v);
                std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                          ((variant<mir::inst::VarId,std::__cxx11::string> *)local_338,pvVar19);
              }
              pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((psVar31->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              _Var23._M_t.
              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
              super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                   (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
                   operator_new(0x40);
              uVar4 = pvVar26->id;
              std::__detail::__variant::
              _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_2d8,
                                (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_338);
              *(undefined ***)
               ((long)_Var23._M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) =
                   &PTR_display_001ee058;
              *(uint32_t *)
               ((long)_Var23._M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = uVar4;
              *(undefined ***)
               _Var23._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_1f8;
              std::__detail::__variant::
              _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)((long)_Var23._M_t.
                                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                          _M_head_impl + 0x18),
                                (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_2d8);
              local_2f8 = (undefined1  [8])
                          _Var23._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
              std::__detail::__variant::
              _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2d8);
              local_358 = local_2f8;
              local_2f8 = (undefined1  [8])0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_308,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_358);
              if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                  != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
                (**(code **)(*(long *)local_358 + 0x28))();
              }
              local_358 = (undefined1  [8])0x0;
              std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>
                           *)local_2f8);
              std::__detail::__variant::
              _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_338);
              break;
            case Ptroffset:
              local_300 = p_Var29;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_a8,
                                *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  **)&((psVar31->
                                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->operands);
              convert_operand_to_value((Value *)local_2d8,this_02,&local_a8);
              pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)(local_2d8 + 8));
              local_258 = (_List_node_base *)CONCAT44(local_258._4_4_,pvVar26->id);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr
                [local_a8.
                 super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 ._M_index]._M_data)((anon_class_1_0_00000001 *)local_338,&local_a8);
              local_a8.
              super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              ._M_index = 0xff;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_d0,
                                (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)(*(long *)&((psVar31->
                                               super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr)->operands + 0x28));
              convert_operand_to_value((Value *)local_338,this_02,&local_d0);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr
                [local_d0.
                 super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 .
                 super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                 ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_d0);
              local_d0.
              super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              .
              super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
              ._M_index = 0xff;
              pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((psVar31->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              DVar24._vptr_Displayable = (_func_int **)operator_new(0x48);
              uVar4 = pvVar26->id;
              local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                   local_330.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
              local_358 = (undefined1  [8])((long)local_2d8 + 8);
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)local_330.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_358,&local_330);
              _Var32._M_head_impl = local_310._M_head_impl;
              local_2d8 = (undefined1  [8])local_310._M_head_impl;
              local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                   local_330.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
              (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
              *DVar24._vptr_Displayable = (_func_int *)local_200;
              (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              *(undefined4 *)(DVar24._vptr_Displayable + 4) = local_258._0_4_;
              local_358 = (undefined1  [8])(DVar24._vptr_Displayable + 6);
              *(undefined1 *)(DVar24._vptr_Displayable + 8) = 0xff;
              *(undefined1 *)(DVar24._vptr_Displayable + 8) =
                   local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_358,
                         (variant<int,_mir::inst::VarId> *)(local_2d8 + 8));
              DVar24._vptr_Displayable[5] = (_func_int *)_Var32._M_head_impl;
              *(undefined2 *)((long)DVar24._vptr_Displayable + 0x41) =
                   local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
              local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_308,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_2d8);
              p_Var29 = local_300;
              if (local_2d8 != (undefined1  [8])0x0) {
                (**(code **)(*(_func_int **)local_2d8 + 0x28))();
              }
              break;
            case Assign:
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                   vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ &
                   0xffffffff00000000;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
              local_358 = (undefined1  [8])local_310._M_head_impl;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_2d8,
                                *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  **)&((psVar31->
                                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->operands);
              if ((byte)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left == 1) {
                local_300 = p_Var29;
                pvVar21 = std::
                          get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                    (*(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       **)&((psVar31->
                                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr)->operands);
                peVar7 = (this_02->nodes).
                         super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pvVar21->id].
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_338 = (undefined1  [8])&vStack_350;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr[(long)(char)(peVar7->mainVar).field_0x18 + 1]._M_data)
                          ((anon_class_8_1_8991fb9c_conflict *)local_338,
                           (variant<int,_mir::inst::VarId> *)&(peVar7->mainVar).field_0x8);
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ = (peVar7->mainVar).shift
                ;
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ =
                     (peVar7->mainVar).shift_amount;
              }
              else {
                local_300 = p_Var29;
                pvVar22 = std::
                          get<0ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                    ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2d8);
                if (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_index != '\0') {
                  vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
                }
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                     (_Uninitialized<int,_true>)*pvVar22;
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
              }
              pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((psVar31->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              DVar24._vptr_Displayable = (_func_int **)operator_new(0x38);
              uVar4 = pvVar26->id;
              local_330.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                   vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
              local_2f8 = (undefined1  [8])&local_330;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_2f8,&vStack_350);
              _Var32._M_head_impl = local_310._M_head_impl;
              local_338 = (undefined1  [8])local_310._M_head_impl;
              local_330.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                   vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
              (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
              *DVar24._vptr_Displayable = (_func_int *)local_240;
              local_2f8 = (undefined1  [8])(DVar24._vptr_Displayable + 4);
              *(undefined1 *)(DVar24._vptr_Displayable + 6) = 0xff;
              *(__index_type *)(DVar24._vptr_Displayable + 6) =
                   local_330.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)local_330.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_2f8,&local_330);
              (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                   (_func_int **)_Var32._M_head_impl;
              *(undefined2 *)((long)DVar24._vptr_Displayable + 0x31) =
                   local_330.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
              local_338 = (undefined1  [8])DVar24._vptr_Displayable;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_308,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_338);
              p_Var29 = local_300;
              if (local_338 != (undefined1  [8])0x0) {
                (**(code **)(*(_func_int **)local_338 + 0x28))();
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                ::_S_vtable._M_arr[(byte)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left].
                _M_data)((anon_class_1_0_00000001 *)local_338,
                         (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2d8);
              break;
            case Call:
              local_300 = p_Var29;
              pvVar19 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  ((((psVar31->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->operands).
                                   super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0xffffffffffffffff);
              local_338 = (undefined1  [8])
                          ((long)&local_330.super__Variant_base<int,_mir::inst::VarId>.
                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
              pcVar8 = (pvVar19->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_338,pcVar8,pcVar8 + pvVar19->_M_string_length);
              std::
              vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::pop_back(&((psVar31->
                           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->operands);
              local_2f8 = (undefined1  [8])0x0;
              vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
              vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
              peVar7 = (psVar31->
                       super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              pvVar9 = (peVar7->operands).
                       super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_268 = psVar31;
              for (pvVar33 = *(pointer *)&peVar7->operands; pvVar33 != pvVar9; pvVar33 = pvVar33 + 1
                  ) {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2d8,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)pvVar33);
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_198,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2d8);
                convert_operand_to_value((Value *)local_358,this_02,&local_198);
                std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
                emplace_back<mir::inst::Value>
                          ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2f8,
                           (Value *)local_358);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_198.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_238,&local_198);
                local_198.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [(byte)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left]._M_data)
                          ((anon_class_1_0_00000001 *)local_358,
                           (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2d8);
              }
              pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((local_268->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              std::
              make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                        ((VarId *)local_2d8,pbVar20,
                         (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_338);
              local_358 = local_2d8;
              local_2d8 = (undefined1  [8])0x0;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_308,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_358);
              p_Var29 = local_300;
              if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                  != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
                (**(code **)(*(long *)local_358 + 0x28))();
              }
              std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>
                           *)local_2d8);
              if ((__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)
                  local_2f8 !=
                  (__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)0x0
                 ) {
                operator_delete((void *)local_2f8,
                                vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ -
                                (long)local_2f8);
              }
              if (local_338 !=
                  (undefined1  [8])
                  ((long)&local_330.super__Variant_base<int,_mir::inst::VarId>.
                          super__Move_assign_alias<int,_mir::inst::VarId>.
                          super__Copy_assign_alias<int,_mir::inst::VarId>.
                          super__Move_ctor_alias<int,_mir::inst::VarId>.
                          super__Copy_ctor_alias<int,_mir::inst::VarId>.
                          super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8)) {
                uVar35 = local_330.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ + 1;
                _Var32._M_head_impl = (Inst *)local_338;
                goto LAB_0012bbcf;
              }
            }
          }
          else if (_Var1 == '\0') {
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58,
                              *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                **)&((psVar31->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->operands);
            convert_operand_to_value((Value *)local_358,this_02,&local_58);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_58.
               super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_58);
            local_58.
            super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_80,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(*(long *)&((psVar31->
                                             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr)->operands + 0x28));
            convert_operand_to_value((Value *)local_2f8,this_02,&local_80);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_80.
               super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2d8,&local_80);
            local_80.
            super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((psVar31->
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->mainVar).field_0x8);
            pvVar16 = std::
                      get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&((psVar31->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->op);
            DVar24._vptr_Displayable = (_func_int **)operator_new(0x60);
            local_238 = (undefined1  [8])&PTR_display_001ee058;
            local_230.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                 (_Uninitialized<int,_true>)pvVar26->id;
            local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_250.super_Displayable._vptr_Displayable = (_func_int **)(local_2d8 + 8);
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)&local_250,&vStack_350);
            local_2d8 = (undefined1  [8])local_310._M_head_impl;
            local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            local_330.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                 vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_250.super_Displayable._vptr_Displayable = (_func_int **)&local_330;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)&local_250,&vStack_2f0);
            local_338 = (undefined1  [8])local_310._M_head_impl;
            local_330.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                 vStack_2f0.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            mir::inst::OpInst::OpInst
                      ((OpInst *)DVar24._vptr_Displayable,(VarId *)local_238,(Value *)local_2d8,
                       (Value *)local_338,*pvVar16);
            local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_308,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_2d8);
            goto LAB_0012b026;
          }
        }
switchD_0012b061_default:
        p_Var29 = p_Var29->_M_next;
      } while (p_Var29 != local_270);
    }
  }
  p_Var29 = local_270->_M_next;
  if (p_Var29 != local_270) {
    local_268 = (pointer)&PTR_display_001f0018;
    do {
      local_310._M_head_impl =
           (Inst *)(this_02->nodes).
                   super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      pp_Var10 = (&(((OpInst *)local_310._M_head_impl)->super_Inst).super_Displayable)
                 [(ulong)*(uint *)&p_Var29[1]._M_next * 2]._vptr_Displayable;
      local_240 = p_Var29;
      if (pp_Var10[0xb] != (_func_int *)0x0) {
        local_300 = (_List_node_base *)(pp_Var10 + 9);
        p_Var15 = local_300->_M_next;
        if (p_Var15 != local_300) {
          local_310._M_head_impl =
               (Inst *)(&(((OpInst *)local_310._M_head_impl)->super_Inst).super_Displayable +
                       (ulong)*(uint *)&p_Var29[1]._M_next * 2);
          do {
            uVar4 = *(uint32_t *)&p_Var15[1]._M_prev;
            pp_Var10 = (((Inst *)&(local_310._M_head_impl)->super_Displayable)->super_Displayable).
                       _vptr_Displayable;
            local_258 = p_Var15;
            DVar24._vptr_Displayable = (_func_int **)operator_new(0x38);
            local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                 *(undefined1 *)(pp_Var10 + 8);
            local_338 = (undefined1  [8])(local_2d8 + 8);
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
              _M_data)((anon_class_8_1_a78179b7_conflict *)local_338,
                       (variant<int,_mir::inst::VarId> *)(pp_Var10 + 6));
            local_2d8 = (undefined1  [8])&PTR_display_001effc8;
            local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                 *(undefined2 *)((long)pp_Var10 + 0x41);
            (((VarId *)(DVar24._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001ee058;
            *(uint32_t *)(DVar24._vptr_Displayable + 2) = uVar4;
            *DVar24._vptr_Displayable = (_func_int *)local_268;
            local_338 = (undefined1  [8])(DVar24._vptr_Displayable + 4);
            *(undefined1 *)(DVar24._vptr_Displayable + 6) = 0xff;
            *(undefined1 *)(DVar24._vptr_Displayable + 6) =
                 local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
              _M_data)((anon_class_8_1_a78179b7_conflict *)local_338,
                       (variant<int,_mir::inst::VarId> *)(local_2d8 + 8));
            (((Value *)(DVar24._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001effc8;
            *(undefined2 *)((long)DVar24._vptr_Displayable + 0x31) =
                 local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
            local_2d8 = (undefined1  [8])DVar24._vptr_Displayable;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_308,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_2d8);
            if (local_2d8 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_2d8 + 0x28))();
            }
            p_Var15 = local_258->_M_next;
          } while (p_Var15 != local_300);
        }
      }
      p_Var29 = local_240->_M_next;
      this_02 = local_260;
    } while (p_Var29 != local_270);
  }
  pBVar13 = local_218;
  if (((local_218->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
       .super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) &&
     (local_330.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
           (_Uninitialized<int,_true>)
           (local_218->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
           _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id,
     local_330.super__Variant_base<int,_mir::inst::VarId>.
     super__Move_assign_alias<int,_mir::inst::VarId>.super__Copy_assign_alias<int,_mir::inst::VarId>
     .super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
     super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage != 0)) {
    local_338 = (undefined1  [8])&PTR_display_001ee058;
    pmVar25 = std::
              map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
              ::operator[](&this_02->var_map,(key_type *)local_338);
    pvVar26 = std::get<1ul,int,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)
                         &(((this_02->nodes).
                            super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[pmVar25->id].
                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mainVar).field_0x8);
    uVar4 = pvVar26->id;
    if ((pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
      (pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar4;
    }
    else {
      (pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001ee058;
      (pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar4;
      (pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    }
    puVar36 = (pBVar13->inst).
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (puVar36 !=
        (pBVar13->inst).
        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar38 = (long)puVar36 * -0x20000000;
      do {
        pIVar6 = (puVar36->_M_t).
                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        if (((pIVar6->dest).id == uVar4) &&
           (iVar14 = (*(pIVar6->super_Displayable)._vptr_Displayable[1])(), this_01 = local_308,
           iVar14 == 1)) {
          lVar11 = *(long *)local_308;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_308,puVar36);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)this_01,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     ((-(lVar11 * 0x20000000 + lVar38) >> 0x1d) + *(long *)this_01));
          break;
        }
        puVar36 = puVar36 + 1;
        lVar38 = lVar38 + -0x100000000;
      } while (puVar36 !=
               (local_218->inst).
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    var_replace::Var_Replace::Var_Replace((Var_Replace *)local_2d8,(MirFunction *)*env);
    p_Var29 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_270->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var29 != local_270) {
      do {
        psVar31 = (local_260->nodes).
                  super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar7 = psVar31[*(uint *)&p_Var29[1]._M_next].
                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if ((peVar7->live_vars).
            super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
            _M_size != 0) {
          psVar31 = psVar31 + *(uint *)&p_Var29[1]._M_next;
          if ((peVar7->mainVar).field_0x18 == '\0') {
            for (puVar34 = *(undefined8 **)
                            &(peVar7->live_vars).
                             super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
                (list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)puVar34 !=
                &peVar7->live_vars; puVar34 = (undefined8 *)*puVar34) {
              local_358 = (undefined1  [8])&PTR_display_001ee058;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                   (_Uninitialized<int,_true>)*(undefined4 *)(puVar34 + 3);
              pmVar27 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                              *)(*env + 0x38),(key_type_conflict *)&vStack_350);
              if (pmVar27->is_phi_var == false) {
                puVar36 = (pointer)(vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                    super__Move_assign_alias<int,_mir::inst::VarId>.
                                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ &
                                   0xffffffff);
                bVar30 = 1;
                goto LAB_0012c524;
              }
            }
            bVar30 = 0;
          }
          else {
            pvVar26 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((psVar31->
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->mainVar).field_0x8);
            local_358 = (undefined1  [8])&PTR_display_001ee058;
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                 (_Uninitialized<int,_true>)pvVar26->id;
            pmVar27 = std::
                      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)(*env + 0x38),(key_type_conflict *)&vStack_350);
            bVar2 = pmVar27->is_phi_var;
            if (bVar2 == false) {
              puVar36 = (pointer)(vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                  super__Move_assign_alias<int,_mir::inst::VarId>.
                                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ &
                                 0xffffffff);
              pmVar27 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                              *)(*env + 0x38),(key_type_conflict *)&vStack_350);
              pmVar27->is_temp_var = false;
            }
            bVar30 = bVar2 ^ 1;
          }
LAB_0012c524:
          if (bVar30 != 0) {
            peVar7 = (psVar31->
                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            for (puVar34 = *(undefined8 **)
                            &(peVar7->live_vars).
                             super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
                (list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)puVar34 !=
                &peVar7->live_vars; puVar34 = (undefined8 *)*puVar34) {
              local_358 = (undefined1  [8])&PTR_display_001ee058;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                   (_Uninitialized<int,_true>)*(undefined4 *)(puVar34 + 3);
              pmVar27 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                              *)(*env + 0x38),(key_type_conflict *)&vStack_350);
              if (pmVar27->is_phi_var == false) {
                if (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage !=
                    (_Uninitialized<int,_true>)(int)puVar36) {
                  local_1d0.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001ee058;
                  local_1d0.id = (uint32_t)
                                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first.
                                 _M_storage;
                  local_1e0.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001ee058;
                  local_1e0.id = (int)puVar36;
                  var_replace::Var_Replace::replace((Var_Replace *)local_2d8,&local_1d0,&local_1e0);
                }
              }
            }
          }
        }
        p_Var29 = p_Var29->_M_next;
      } while (p_Var29 != local_270);
    }
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
    ::~_Rb_tree(&local_2a0);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                 *)(local_2d8 + 8));
  }
  return;
}

Assistant:

void export_insts(mir::inst::BasicBlk& block) {
    auto& inst = block.inst;
    for (auto iter = nodes.begin(); iter != nodes.end(); ++iter) {
      iter->get()->init_main_var();
    }
    while (added.size() < nodes.size()) {
      for (int i = nodes.size() - 1; i >= 0; --i) {
        exportNode(i);
      }
    }
    inst.clear();
    // for (auto& varpair : var_map) {
    //   if (varpair.first > 10000) {
    //     break;
    //   }
    //   if (varpair.first >= 1) {
    //     inst.push_back(std::make_unique<mir::inst::AssignInst>(
    //         std::get<mir::inst::VarId>(nodes[varpair.second.id]->mainVar),
    //         varpair.first));
    //   }
    // }
    std::reverse(exportQueue.begin(), exportQueue.end());
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (!node->is_leaf) {
        auto opKind = node->op.index();
        switch (opKind) {
          case 0: {
            auto lhs = convert_operand_to_value(node->operands[0]);
            auto rhs = convert_operand_to_value(node->operands[1]);
            auto opInst = std::make_unique<mir::inst::OpInst>(
                std::get<mir::inst::VarId>(node->mainVar), lhs, rhs,
                std::get<NormOp>(node->op));
            inst.push_back(std::move(opInst));
            break;
          }

          case 1: {
            switch (std::get<ExtraNormOp>(node->op)) {
              case ExtraNormOp::Ref: {
                std::variant<mir::inst::VarId, std::string> val;
                if (node->operands[0].index() == 1) {
                  val = std::get<mir::inst::VarId>(
                      nodes[std::get<NodeId>(node->operands[0]).id]->mainVar);
                  //这里可能的VarId是局部数组，理论上不会出现int成为mainVar的情况

                } else {
                  val = std::get<std::string>(node->operands[0]);
                }
                inst.push_back(std::make_unique<mir::inst::RefInst>(
                    std::get<mir::inst::VarId>(node->mainVar), val));
                break;
              }
              case ExtraNormOp::Ptroffset: {
                auto ptr = std::get<mir::inst::VarId>(
                    convert_operand_to_value(node->operands[0]));
                auto offset = convert_operand_to_value(node->operands[1]);
                auto ptrInst = std::make_unique<mir::inst::PtrOffsetInst>(
                    std::get<mir::inst::VarId>(node->mainVar), ptr, offset);
                inst.push_back(std::move(ptrInst));
                break;
              }
              case ExtraNormOp::Assign: {
                mir::inst::Value src(0);
                auto operand = node->operands[0];
                if (operand.index() == 1) {
                  auto srcId = std::get<NodeId>(node->operands[0]);
                  src = nodes[srcId.id]->mainVar;
                } else {
                  src = std::get<int>(operand);
                }

                auto assignInst = std::make_unique<mir::inst::AssignInst>(
                    std::get<mir::inst::VarId>(node->mainVar), src);
                inst.push_back(std::move(assignInst));
                break;
              }
              case ExtraNormOp::Call: {
                auto func = std::get<std::string>(
                    node->operands[node->operands.size() - 1]);
                node->operands.pop_back();
                std::vector<mir::inst::Value> params;
                for (auto operand : node->operands) {
                  params.push_back(convert_operand_to_value(operand));
                }
                auto callInst = std::make_unique<mir::inst::CallInst>(
                    std::get<mir::inst::VarId>(node->mainVar), func, params);
                inst.push_back(std::move(callInst));
              }
            }

            break;
          }

          case 2: {
            if (std::get<InNormOp>(node->op) == InNormOp::Call) {
              auto func = std::get<std::string>(
                  node->operands[node->operands.size() - 1]);
              node->operands.pop_back();
              std::vector<mir::inst::Value> params;
              for (auto operand : node->operands) {
                params.push_back(convert_operand_to_value(operand));
              }
              auto callInst = std::make_unique<mir::inst::CallInst>(
                  std::get<mir::inst::VarId>(node->mainVar), func, params);
              inst.push_back(std::move(callInst));
            }
            if (std::get<InNormOp>(node->op) == InNormOp::Phi) {
              std::vector<mir::inst::VarId> vars;
              for (auto operand : node->operands) {
                auto oper_node = nodes[std::get<NodeId>(operand).id];
                mir::inst::VarId var;
                if (oper_node->mainVar.index() == 0) {
                  // imm

                  if (oper_node->live_vars.size()) {
                    var = oper_node->live_vars.front();
                  } else {
                    var = oper_node->local_vars.front();
                    auto assignInst = std::make_unique<mir::inst::AssignInst>(
                        var, node->mainVar);
                    inst.push_back(std::move(assignInst));
                  }
                } else {
                  var = std::get<mir::inst::VarId>(oper_node->mainVar);
                }
                vars.push_back(var);
              }
              auto phiInst = std::make_unique<mir::inst::PhiInst>(
                  std::get<mir::inst::VarId>(node->mainVar), vars);
              inst.push_back(std::move(phiInst));
            } else if (std::get<InNormOp>(node->op) == InNormOp::Load) {
              auto src = nodes[std::get<NodeId>(node->operands[0]).id]->mainVar;
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[1]);
                auto loadInst = std::make_unique<mir::inst::LoadOffsetInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto loadInst = std::make_unique<mir::inst::LoadInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar));
                inst.push_back(std::move(loadInst));
              }

            } else if (std::get<InNormOp>(node->op) == InNormOp::Store) {
              auto val = convert_operand_to_value(node->operands[0]);
              auto dest = convert_operand_to_value(node->operands[1]);
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[2]);
                auto loadInst = std::make_unique<mir::inst::StoreOffsetInst>(
                    val, std::get<mir::inst::VarId>(dest), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto storeInst = std::make_unique<mir::inst::StoreInst>(
                    val, std::get<mir::inst::VarId>(dest));
                inst.push_back(std::move(storeInst));
              }
            }
            break;
          }
          default:;
        }
      }
      // if (node->live_vars.size()) {
      //   for (auto var : node->live_vars) {
      //     //
      //     if(node->op.index()==1&&std::get<ExtraNormOp>(node->op)==ExtraNormOp::Assign&&node->operands)
      //     auto assignInst =
      //         std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
      //     inst.push_back(std::move(assignInst));
      //   }
      // }
    }
    // this must be in the end, or the livevar might overides the leaf var used
    // after this because they share the same reg
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        for (auto var : node->live_vars) {
          auto assignInst =
              std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
          inst.push_back(std::move(assignInst));
        }
      }
    }

    auto& jump = block.jump;
    if (!jump.cond_or_ret.has_value() || jump.cond_or_ret.value().id == 0) {
      return;
    }
    auto varId = jump.cond_or_ret.value();
    auto& node = nodes[var_map[varId].id];
    mir::inst::VarId var = std::get<mir::inst::VarId>(node->mainVar);
    jump.cond_or_ret = var;
    for (auto iter = block.inst.begin(); iter != block.inst.end();) {
      auto& inst = *iter;
      if (inst->dest == var && inst->inst_kind() == mir::inst::InstKind::Op) {
        int idx = iter - block.inst.begin();
        block.inst.push_back(std::move(inst));
        iter = block.inst.begin() + idx;
        iter = block.inst.erase(iter);

        break;
      } else {
        iter++;
      }
    }

    // replace
    var_replace::Var_Replace vp(env->func);
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        std::optional<mir::inst::VarId> not_phi_var;
        if (!node->mainVar.is_immediate()) {
          auto var = std::get<mir::inst::VarId>(node->mainVar);
          if (!env->func.variables.at(var.id).is_phi_var) {
            not_phi_var = var;
            env->func.variables.at(var.id).is_temp_var = false;
          }
        } else {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var) {
              not_phi_var = var;
              break;
            }
          }
        }

        if (not_phi_var.has_value()) {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var &&
                var != not_phi_var.value()) {
              vp.replace(var, not_phi_var.value());
            }
          }
        }
      }
    }
  }